

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::query_abi_cxx11_
          (CommonCore *this,string_view target,string_view queryStr,HelicsSequencingModes mode)

{
  string_view string1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  string_view federateName;
  string_view queryStr_00;
  string_view queryStr_01;
  bool bVar1;
  bool bVar2;
  BrokerState BVar3;
  element_type *this_00;
  CommonCore *__a;
  char *in_RCX;
  size_t in_RDX;
  action_t newAction;
  CommonCore *in_RSI;
  LogBuffer *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int in_stack_00000008;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult;
  future_status status;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult_1;
  string ret_1;
  FederateState *fed;
  __int_type_conflict index;
  ActionMessage querycmd;
  json base;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  ActionMessage *in_stack_fffffffffffffba8;
  FederateState *in_stack_fffffffffffffbb0;
  json *in_stack_fffffffffffffbb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  action_t in_stack_fffffffffffffbcc;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  CommonCore *in_stack_fffffffffffffbd8;
  allocator<char> *in_stack_fffffffffffffbe0;
  CommonCore *in_stack_fffffffffffffbe8;
  string *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  int index_00;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc00;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc08;
  CommonCore *in_stack_fffffffffffffc10;
  JsonErrorCodes JVar4;
  size_t in_stack_fffffffffffffc18;
  json *base_00;
  LogBuffer *buffer;
  undefined1 local_3a9 [109];
  future_status local_33c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined4 in_stack_fffffffffffffd10;
  LocalFederateId in_stack_fffffffffffffd14;
  json *in_stack_fffffffffffffd18;
  CommonCore *in_stack_fffffffffffffd20;
  CommonCore *in_stack_fffffffffffffd78;
  size_t in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  GlobalFederateId local_1ec;
  ActionMessage local_1e8;
  allocator<char> local_129 [48];
  undefined1 in_stack_ffffffffffffff07;
  FederateState *in_stack_ffffffffffffff08;
  json_value in_stack_ffffffffffffff10;
  string_view in_stack_ffffffffffffff18;
  undefined1 local_d8 [52];
  int local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  __sv_type local_70;
  undefined8 local_60;
  undefined8 local_58;
  size_t local_40;
  char *local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  buffer = in_RDI;
  local_28 = in_R8;
  uStack_20 = in_R9;
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x4a2257);
  if (CONNECTED_ERROR < BVar3) {
    local_40 = local_18._M_len;
    local_38 = local_18._M_str;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
    JVar4 = (JsonErrorCodes)((ulong)in_stack_fffffffffffffc10 >> 0x20);
    __x._M_str = (char *)in_stack_fffffffffffffbe0;
    __x._M_len = (size_t)in_stack_fffffffffffffbd8;
    __y._M_len._4_4_ = in_stack_fffffffffffffbcc;
    __y._M_len._0_4_ = in_stack_fffffffffffffbc8;
    __y._M_str._0_4_ = in_stack_fffffffffffffbd0;
    __y._M_str._4_4_ = in_stack_fffffffffffffbd4;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      local_60 = local_18._M_len;
      local_58 = local_18._M_str;
      getIdentifier_abi_cxx11_(in_RSI);
      local_70 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbb0);
      __x_00._M_str = (char *)in_stack_fffffffffffffbe0;
      __x_00._M_len = (size_t)in_stack_fffffffffffffbd8;
      __y_00._M_len._4_4_ = in_stack_fffffffffffffbcc;
      __y_00._M_len._0_4_ = in_stack_fffffffffffffbc8;
      __y_00._M_str._0_4_ = in_stack_fffffffffffffbd0;
      __y_00._M_str._4_4_ = in_stack_fffffffffffffbd4;
      bVar1 = std::operator==(__x_00,__y_00);
      if ((!bVar1) &&
         (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18), !bVar1))
      goto LAB_004a2564;
    }
    local_a0 = local_28;
    local_98 = uStack_20;
    queryStr_00._M_str = in_stack_fffffffffffffd88;
    queryStr_00._M_len = in_stack_fffffffffffffd80;
    quickCoreQueries_abi_cxx11_(in_stack_fffffffffffffd78,queryStr_00);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a2398);
    if (bVar1) {
      local_d8._32_8_ = local_28;
      local_d8._40_8_ = uStack_20;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
      __x_01._M_str = (char *)in_stack_fffffffffffffbe0;
      __x_01._M_len = (size_t)in_stack_fffffffffffffbd8;
      __y_01._M_len._4_4_ = in_stack_fffffffffffffbcc;
      __y_01._M_len._0_4_ = in_stack_fffffffffffffbc8;
      __y_01._M_str._0_4_ = in_stack_fffffffffffffbd0;
      __y_01._M_str._4_4_ = in_stack_fffffffffffffbd4;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        in_stack_fffffffffffffc08 =
             (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
        JVar4 = (JsonErrorCodes)((ulong)local_d8 >> 0x20);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        base_00 = (json *)&stack0xffffffffffffff08;
        std::
        function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
        ::function((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                    *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        loadBasicJsonInfo(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                          (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                           *)CONCAT44(in_stack_fffffffffffffd14.fid,in_stack_fffffffffffffd10));
        std::
        function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
        ::~function((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                     *)0x4a2478);
        this_00 = CLI::std::
                  __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4a248c);
        LogManager::getLogBuffer(this_00);
        bufferToJson(buffer,base_00);
        fileops::generateJsonString
                  (in_stack_fffffffffffffbb8,SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
        local_a4 = 1;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffbb0);
      }
      else {
        local_a4 = 0;
      }
    }
    else {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbe8);
      local_a4 = 1;
    }
    std::__cxx11::string::~string(&in_stack_fffffffffffffbb0->name);
    if (local_a4 != 0) {
      return (string *)in_RDI;
    }
LAB_004a2564:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0
              );
    generateJsonErrorResponse(JVar4,(string *)in_stack_fffffffffffffc08);
    std::__cxx11::string::~string(&in_stack_fffffffffffffbb0->name);
    std::allocator<char>::~allocator(local_129);
    return (string *)in_RDI;
  }
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             in_stack_fffffffffffffbcc);
  local_1e8.source_id.gid = -0x396fe;
  GlobalFederateId::GlobalFederateId(&local_1ec,(GlobalBrokerId)0x0);
  local_1e8.dest_id.gid = local_1ec.gid;
  SmallBuffer::operator=
            ((SmallBuffer *)in_stack_fffffffffffffbd8,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  local_1e8.messageID =
       std::__atomic_base<int>::operator++(&(in_RSI->queryCounter).super___atomic_base<int>);
  string1._M_str = (char *)in_stack_fffffffffffffbc0;
  string1._M_len = (size_t)in_stack_fffffffffffffbb8;
  ActionMessage::setStringData((ActionMessage *)in_stack_fffffffffffffbb0,string1);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
  __x_02._M_str = (char *)in_stack_fffffffffffffbe0;
  __x_02._M_len = (size_t)in_stack_fffffffffffffbd8;
  __y_02._M_len._4_4_ = in_stack_fffffffffffffbcc;
  __y_02._M_len._0_4_ = in_stack_fffffffffffffbc8;
  __y_02._M_str._0_4_ = in_stack_fffffffffffffbd0;
  __y_02._M_str._4_4_ = in_stack_fffffffffffffbd4;
  bVar1 = std::operator==(__x_02,__y_02);
  if (bVar1) {
LAB_004a27c1:
    bVar1 = false;
    queryStr_01._M_str = in_stack_fffffffffffffd88;
    queryStr_01._M_len = in_stack_fffffffffffffd80;
    quickCoreQueries_abi_cxx11_(in_stack_fffffffffffffd78,queryStr_01);
    bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a2807);
    if (bVar2) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
      __x_04._M_str = (char *)in_stack_fffffffffffffbe0;
      __x_04._M_len = (size_t)in_stack_fffffffffffffbd8;
      __y_04._M_len._4_4_ = in_stack_fffffffffffffbcc;
      __y_04._M_len._0_4_ = in_stack_fffffffffffffbc8;
      __y_04._M_str._0_4_ = in_stack_fffffffffffffbd0;
      __y_04._M_str._4_4_ = in_stack_fffffffffffffbd4;
      bVar2 = std::operator==(__x_04,__y_04);
      if (bVar2) {
        in_stack_fffffffffffffbf0 =
             getAddress_abi_cxx11_
                       ((CommonCore *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0))
        ;
        generateJsonQuotedString((string *)in_stack_fffffffffffffbd8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        std::__cxx11::string::~string(&in_stack_fffffffffffffbb0->name);
        bVar1 = true;
        local_a4 = 1;
      }
      else {
        newAction = cmd_broker_query_ordered;
        if (in_stack_00000008 == 0) {
          newAction = cmd_broker_query;
        }
        ActionMessage::setAction(&local_1e8,newAction);
        local_1e8.dest_id.gid = -0x396fe;
        local_a4 = 0;
      }
    }
    else {
      bVar1 = true;
      local_a4 = 1;
    }
    if (!bVar1) {
      std::__cxx11::string::~string(&in_stack_fffffffffffffbb0->name);
    }
    if (local_a4 != 0) goto LAB_004a2fc0;
  }
  else {
    getIdentifier_abi_cxx11_(in_RSI);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbb0);
    __x_03._M_str = (char *)in_stack_fffffffffffffbe0;
    __x_03._M_len = (size_t)in_stack_fffffffffffffbd8;
    __y_03._M_len._4_4_ = in_stack_fffffffffffffbcc;
    __y_03._M_len._0_4_ = in_stack_fffffffffffffbc8;
    __y_03._M_str._0_4_ = in_stack_fffffffffffffbd0;
    __y_03._M_str._4_4_ = in_stack_fffffffffffffbd4;
    bVar1 = std::operator==(__x_03,__y_03);
    if ((bVar1) ||
       (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18), bVar1))
    goto LAB_004a27c1;
  }
  bVar1 = GlobalFederateId::operator!=(&local_1e8.dest_id,(GlobalFederateId)0xfffc6902);
  if (bVar1) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
    __x_05._M_str = (char *)in_stack_fffffffffffffbe0;
    __x_05._M_len = (size_t)in_stack_fffffffffffffbd8;
    __y_05._M_len._4_4_ = in_stack_fffffffffffffbcc;
    __y_05._M_len._0_4_ = in_stack_fffffffffffffbc8;
    __y_05._M_str._0_4_ = in_stack_fffffffffffffbd0;
    __y_05._M_str._4_4_ = in_stack_fffffffffffffbd4;
    bVar1 = std::operator==(__x_05,__y_05);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      LocalFederateId::LocalFederateId((LocalFederateId *)&stack0xfffffffffffffd14,0);
      in_stack_fffffffffffffbd8 =
           (CommonCore *)
           getFederateAt(in_stack_fffffffffffffbe8,
                         (LocalFederateId)(BaseType)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
      __a = in_stack_fffffffffffffbd8;
    }
    else {
      federateName._M_str = (char *)buffer;
      federateName._M_len = in_stack_fffffffffffffc18;
      __a = (CommonCore *)getFederate(in_stack_fffffffffffffc10,federateName);
      in_stack_fffffffffffffbe8 = __a;
    }
    if ((__a != (CommonCore *)0x0) &&
       (local_1e8.dest_id =
             std::atomic::operator_cast_to_GlobalFederateId
                       ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffba8),
       in_stack_00000008 != 1)) {
      local_328 = local_28;
      uStack_320 = uStack_20;
      federateQuery_abi_cxx11_
                ((CommonCore *)in_stack_ffffffffffffff10.object,in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff07);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::getFuture(in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
        FederateState::addAction(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        local_33c = timeout;
LAB_004a2bbd:
        do {
          JVar4 = (JsonErrorCodes)((ulong)in_stack_fffffffffffffc10 >> 0x20);
          if (local_33c != timeout) {
            in_stack_fffffffffffffbb0 = (FederateState *)local_3a9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8,
                       (allocator<char> *)__a);
            generateJsonErrorResponse(JVar4,(string *)in_stack_fffffffffffffc08);
            std::__cxx11::string::~string(&in_stack_fffffffffffffbb0->name);
            std::allocator<char>::~allocator((allocator<char> *)local_3a9);
            goto LAB_004a2e84;
          }
          local_3a9._93_4_ = 0x32;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1000l>> *)(local_3a9 + 0x61),
                     (int *)(local_3a9 + 0x5d));
          local_33c = std::__basic_future<std::__cxx11::string>::wait_for<long,std::ratio<1l,1000l>>
                                ((__basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffbb0,
                                 (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffba8
                                );
          if (local_33c == ready) {
LAB_004a2c5a:
            local_3a9[0x5c] = 0;
            std::
            future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::get((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffbd8);
            gmlc::concurrency::
            DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::finishedWithValue(in_stack_fffffffffffffc00,
                                (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
            local_3a9[0x5c] = 1;
            goto LAB_004a2e84;
          }
          if (local_33c != timeout) {
            if (local_33c == deferred) goto LAB_004a2c5a;
            local_33c = ready;
            goto LAB_004a2bbd;
          }
          local_3a9._33_8_ = local_28;
          local_3a9._41_8_ = uStack_20;
          federateQuery_abi_cxx11_
                    ((CommonCore *)in_stack_ffffffffffffff10.object,in_stack_ffffffffffffff08,
                     in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff07);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string(&in_stack_fffffffffffffbb0->name);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
        } while (((bVar1 ^ 0xffU) & 1) == 0);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::finishedWithValue(in_stack_fffffffffffffc00,
                            (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbf0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbe8);
LAB_004a2e84:
        local_a4 = 1;
        std::
        future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x4a2e91);
      }
      else {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbf0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbe8);
        local_a4 = 1;
      }
      std::__cxx11::string::~string(&in_stack_fffffffffffffbb0->name);
      goto LAB_004a2fc0;
    }
  }
  index_00 = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  getFuture(in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
  BrokerBase::addActionMessage((BrokerBase *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            ((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffbd8);
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  finishedWithValue(in_stack_fffffffffffffc00,index_00);
  local_a4 = 1;
  std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x4a2faf);
LAB_004a2fc0:
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffbb0);
  return (string *)in_RDI;
}

Assistant:

std::string CommonCore::query(std::string_view target,
                              std::string_view queryStr,
                              HelicsSequencingModes mode)
{
    if (getBrokerState() >= BrokerState::TERMINATING) {
        if (target == "core" || target == getIdentifier() || target.empty()) {
            auto res = quickCoreQueries(queryStr);
            if (!res.empty()) {
                return res;
            }
            if (queryStr == "logs") {
                nlohmann::json base;
                loadBasicJsonInfo(base, nullptr);
                bufferToJson(mLogManager->getLogBuffer(), base);
                return fileops::generateJsonString(base);
            }
        }
        return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Core has terminated");
    }
    ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_QUERY : CMD_QUERY_ORDERED);
    querycmd.source_id = gDirectCoreId;
    querycmd.dest_id = parent_broker_id;
    querycmd.payload = queryStr;
    auto index = ++queryCounter;
    querycmd.messageID = index;
    querycmd.setStringData(target);

    if (target == "core" || target == getIdentifier() || target.empty()) {
        auto res = quickCoreQueries(queryStr);
        if (!res.empty()) {
            return res;
        }
        if (queryStr == "address") {
            res = generateJsonQuotedString(getAddress());
            return res;
        }
        querycmd.setAction(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                 CMD_BROKER_QUERY_ORDERED);
        querycmd.dest_id = gDirectCoreId;
    }
    if (querycmd.dest_id != gDirectCoreId) {
        // default into a federate query
        auto* fed =
            (target != "federate") ? getFederate(target) : getFederateAt(LocalFederateId(0));
        if (fed != nullptr) {
            querycmd.dest_id = fed->global_id;
            if (mode != HELICS_SEQUENCING_MODE_ORDERED) {
                std::string ret = federateQuery(fed, queryStr, false);
                if (ret != "#wait") {
                    return ret;
                }

                auto queryResult = activeQueries.getFuture(querycmd.messageID);
                fed->addAction(std::move(querycmd));
                std::future_status status = std::future_status::timeout;
                while (status == std::future_status::timeout) {
                    status = queryResult.wait_for(std::chrono::milliseconds(50));
                    switch (status) {
                        case std::future_status::ready:
                        case std::future_status::deferred: {
                            auto qres = queryResult.get();
                            activeQueries.finishedWithValue(index);
                            return qres;
                        }
                        case std::future_status::timeout: {  // federate query may need to wait or
                                                             // can get the result now
                            ret = federateQuery(fed,
                                                queryStr,
                                                mode == HELICS_SEQUENCING_MODE_ORDERED);
                            if (ret != "#wait") {
                                activeQueries.finishedWithValue(index);
                                return ret;
                            }
                        } break;
                        default:
                            status = std::future_status::ready;  // LCOV_EXCL_LINE
                    }
                }
                return generateJsonErrorResponse(JsonErrorCodes::INTERNAL_ERROR,
                                                 "Unexpected Error #13");  // LCOV_EXCL_LINE
            }
        }
    }

    auto queryResult = activeQueries.getFuture(querycmd.messageID);
    addActionMessage(std::move(querycmd));
    auto ret = queryResult.get();
    activeQueries.finishedWithValue(index);
    return ret;
}